

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

bool __thiscall
Sudoku::columnCheck(Sudoku *this,
                   list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                   vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int value;
  int y;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint posX;
  uint local_58;
  
  posX = 0;
  iVar4 = this->squared_size_;
  do {
    if (iVar4 <= (int)posX) {
LAB_00110f4c:
      return (int)posX < iVar4;
    }
    iVar5 = iVar4;
    for (value = 1; value <= iVar5; value = value + 1) {
      uVar9 = 0;
      local_58 = 0;
      uVar8 = 0;
      while (uVar7 = (uint)uVar8, (int)uVar7 < iVar5) {
        iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)posX,uVar8);
        iVar5 = Field::value((testFields->
                             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar5].
                             super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (iVar5 == value) goto LAB_00110f0a;
        iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)posX,uVar8);
        bVar3 = Field::valuePossible
                          ((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[iVar5].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
        uVar9 = uVar9 + bVar3;
        if (1 < uVar9) goto LAB_00110f0a;
        if (bVar3) {
          local_58 = uVar7;
        }
        iVar5 = this->squared_size_;
        uVar8 = (ulong)(uVar7 + 1);
      }
      if (uVar9 == 1) {
        if (debug) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Column check (column ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,posX);
          poVar6 = std::operator<<(poVar6,"): value ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,value);
          poVar6 = std::operator<<(poVar6," has to be in field (");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,posX);
          poVar6 = std::operator<<(poVar6,",");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_58);
          poVar6 = std::operator<<(poVar6,",");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->current_z_);
          poVar6 = std::operator<<(poVar6,")");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        p_Var2 = (furtherWays_->
                 super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                 _M_impl._M_node.super__List_node_base._M_prev;
        piVar1 = (int *)((long)&p_Var2[1]._M_next + 4);
        *piVar1 = *piVar1 + 1;
        iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)posX,(ulong)local_58);
        FurtherWays::addWay((FurtherWays *)(p_Var2 + 1),iVar5,posX,local_58,this->current_z_,value,
                            onlyPositionInColumn);
        if (!recordFullFurtherWays) {
          iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)posX,(ulong)local_58);
          Field::setValue((testFields->
                          super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[iVar5].
                          super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
          goto LAB_00110f4c;
        }
      }
LAB_00110f0a:
      iVar5 = this->squared_size_;
    }
    posX = posX + 1;
    iVar4 = iVar5;
  } while( true );
}

Assistant:

bool Sudoku::columnCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check columns, if there are values that can only be at one position
  restart = false;
  for (int x = 0; x < squared_size_; x++)
  {

    for (int value = 1; value <= squared_size_; value++)
    {
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionY = 0;
      for (int y = 0; y < squared_size_; y++)
      {
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionY = y;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"Column check (column "<<x<<"): value "<<value<<" has to be in field ("<<x<<","<<positionY<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nColumnCheckMatches++;
        furtherWays_.back().addWay(index(x,positionY), x, positionY, current_z_, value, FurtherWays::Reason::onlyPositionInColumn);

        if(!recordFullFurtherWays)
        {
          testFields[index(x,positionY)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }

  return restart;
}